

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadUSDZFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  string _err;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string filepath;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  assets;
  MMapFileHandle handle;
  string local_f0;
  Stage *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  local_88;
  MMapFileHandle local_68;
  
  local_88.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  io::ExpandFilePath(&local_a8,(string *)_filename,(void *)0x0);
  bVar1 = io::IsMMapSupported();
  if (!bVar1) {
    local_c8.field_2._M_allocated_capacity = 0;
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    bVar2 = false;
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
                              (string *)err,&local_a8,(long)options->max_memory_limit_in_mb << 0x14,
                              (void *)0x0);
    if (bVar1) {
      if (local_c8._M_string_length - (long)local_c8._M_dataplus._M_p < 0x76) {
        if (err != (string *)0x0) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f0,"File size too short. Looks like this file is not a USDZ : \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a8);
          ::std::operator+(&local_68.filename,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f0,"\"\n");
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        bVar2 = false;
      }
      else {
        bVar2 = LoadUSDZFromMemory((uint8_t *)local_c8._M_dataplus._M_p,
                                   local_c8._M_string_length - (long)local_c8._M_dataplus._M_p,
                                   (string *)&local_a8,stage,warn,err,options);
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
    goto LAB_00115653;
  }
  local_68.filename._M_dataplus._M_p = (pointer)&local_68.filename.field_2;
  local_68.filename._M_string_length = 0;
  local_68.filename.field_2._M_local_buf[0] = '\0';
  local_68.writable = false;
  local_68.addr = (uint8_t *)0x0;
  local_68.size = 0;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_d0 = stage;
  bVar1 = io::MMapFile(&local_a8,&local_68,false,&local_f0);
  if (bVar1) {
    if ((warn != (string *)0x0) && (local_f0._M_string_length != 0)) {
      ::std::operator+(&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"\n");
      psVar3 = warn;
LAB_00115570:
      ::std::__cxx11::string::append((string *)psVar3);
      ::std::__cxx11::string::_M_dispose();
    }
  }
  else if (err != (string *)0x0) {
    ::std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                     "\n");
    psVar3 = err;
    goto LAB_00115570;
  }
  ::std::__cxx11::string::_M_dispose();
  if (bVar1) {
    bVar2 = LoadUSDZFromMemory(local_68.addr,local_68.size,(string *)&local_a8,local_d0,warn,err,
                               options);
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    io::UnmapFile(&local_68,&local_f0);
    if ((warn != (string *)0x0) && (local_f0._M_string_length != 0)) {
      ::std::operator+(&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"\n");
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    bVar2 = false;
  }
  ::std::__cxx11::string::_M_dispose();
LAB_00115653:
  ::std::__cxx11::string::_M_dispose();
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ::~vector(&local_88);
  return bVar2;
}

Assistant:

bool LoadUSDZFromFile(const std::string &_filename, Stage *stage,
                      std::string *warn, std::string *err,
                      const USDLoadOptions &options) {
  // <filename, byte_begin, byte_end>
  std::vector<std::tuple<std::string, size_t, size_t>> assets;

  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);


  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDZFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;
  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      return false;
    }

    if (data.size() < (11 * 8) + 30) {  // 88 for USDC header, 30 for ZIP header
      // ???
      if (err) {
        (*err) += "File size too short. Looks like this file is not a USDZ : \"" +
                  filepath + "\"\n";
      }
      return false;
    }

    return LoadUSDZFromMemory(data.data(), data.size(), filepath, stage, warn,
                              err, options);
  }
}